

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void TestSuite::spawnThread(ThreadInternalArgs *args)

{
  int iVar1;
  ThreadArgs *in_RDI;
  
  iVar1 = std::function<int_(TestSuite::ThreadArgs_*)>::operator()
                    ((function<int_(TestSuite::ThreadArgs_*)> *)args,in_RDI);
  *(int *)(in_RDI + 0x28) = iVar1;
  return;
}

Assistant:

static void spawnThread(ThreadInternalArgs* args) {
        args->rc = args->func(args->userArgs);
    }